

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_rand.c
# Opt level: O1

int BN_rand(BIGNUM *rnd,int bits,int top,int bottom)

{
  int iVar1;
  uint8_t *buf;
  BIGNUM *pBVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  int iVar4;
  
  iVar4 = bits + 0xe;
  if (-1 < bits + 7) {
    iVar4 = bits + 7;
  }
  iVar4 = iVar4 >> 3;
  buf = (uint8_t *)CRYPTO_malloc(iVar4,(char *)CONCAT44(in_register_00000034,bits),top);
  uVar3 = 0;
  if (buf != (uint8_t *)0x0) {
    iVar1 = RAND_buf(buf,iVar4);
    if (iVar1 != 0) {
      pBVar2 = BN_bin2bn(buf,iVar4,rnd);
      uVar3 = (uint)(pBVar2 != (BIGNUM *)0x0);
    }
  }
  CRYPTO_clear_free(buf,(long)iVar4);
  return uVar3;
}

Assistant:

int BN_rand(BIGNUM *rnd, int bits)
{
    unsigned char *buf = NULL;
    int ret = 0, bytes;

    bytes = (bits + 7) / 8;
    buf = CRYPTO_malloc(bytes);
    if (buf == NULL) {
        //BNerr(BN_F_BNRAND, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    
    if(!RAND_buf(buf, bytes))
    {
        goto err;
    }

    if (!BN_bin2bn(buf, bytes, rnd))
    {
        goto err;
    }
    ret = 1;
err:
    CRYPTO_clear_free(buf, bytes);
    bn_check_top(rnd);
    return (ret);
}